

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O1

void __thiscall
bioparser::test::BioparserMhapTest_ParseInChunks_Test::~BioparserMhapTest_ParseInChunks_Test
          (BioparserMhapTest_ParseInChunks_Test *this)

{
  Parser<bioparser::test::MhapOverlap> *pPVar1;
  
  (this->super_BioparserMhapTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserMhapTest_00158558;
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::~vector(&(this->super_BioparserMhapTest).o);
  pPVar1 = (this->super_BioparserMhapTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>.
           _M_head_impl;
  if (pPVar1 != (Parser<bioparser::test::MhapOverlap> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
  }
  (this->super_BioparserMhapTest).p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
  .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>._M_head_impl =
       (Parser<bioparser::test::MhapOverlap> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, ParseInChunks) {
  Setup("sample.mhap");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}